

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O1

vector<cmWatchpoint,_std::allocator<cmWatchpoint>_> * __thiscall
cmDebugger_impl::GetWatchpoints
          (vector<cmWatchpoint,_std::allocator<cmWatchpoint>_> *__return_storage_ptr__,
          cmDebugger_impl *this)

{
  int iVar1;
  int iVar2;
  _Rb_tree_node_base *p_Var3;
  _Base_ptr this_00;
  bool bVar4;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->breakpointMutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  (__return_storage_ptr__->super__Vector_base<cmWatchpoint,_std::allocator<cmWatchpoint>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cmWatchpoint,_std::allocator<cmWatchpoint>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cmWatchpoint,_std::allocator<cmWatchpoint>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cmWatchpoint,_std::allocator<cmWatchpoint>_>::reserve
            (__return_storage_ptr__,
             (this->activeWatchpoints)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  p_Var3 = (this->activeWatchpoints)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var3 == &(this->activeWatchpoints)._M_t._M_impl.super__Rb_tree_header)
    {
      pthread_mutex_unlock((pthread_mutex_t *)&this->breakpointMutex);
      return __return_storage_ptr__;
    }
    this_00 = p_Var3[1]._M_left;
    if (this_00 != (_Base_ptr)0x0) {
      iVar2 = *(int *)&this_00->_M_parent;
      do {
        if (iVar2 == 0) {
          this_00 = (_Base_ptr)0x0;
          break;
        }
        LOCK();
        iVar1 = *(int *)&this_00->_M_parent;
        bVar4 = iVar2 == iVar1;
        if (bVar4) {
          *(int *)&this_00->_M_parent = iVar2 + 1;
          iVar1 = iVar2;
        }
        iVar2 = iVar1;
        UNLOCK();
      } while (!bVar4);
    }
    if (this_00 == (_Base_ptr)0x0) {
      bVar4 = true;
    }
    else {
      bVar4 = *(int *)&this_00->_M_parent == 0;
    }
    if ((!bVar4) && ((value_type *)p_Var3[1]._M_parent != (value_type *)0x0)) {
      std::vector<cmWatchpoint,_std::allocator<cmWatchpoint>_>::push_back
                (__return_storage_ptr__,(value_type *)p_Var3[1]._M_parent);
    }
    if (this_00 != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
    }
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  } while( true );
}

Assistant:

std::vector<cmWatchpoint> GetWatchpoints() const override
  {
    std::lock_guard<std::mutex> l(breakpointMutex);
    std::vector<cmWatchpoint> rtn;
    rtn.reserve(activeWatchpoints.size());
    for (auto& watchWeak : activeWatchpoints) {
      if (auto watch = watchWeak.second.lock()) {
        rtn.push_back(*watch);
      }
    }
    return rtn;
  }